

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O3

int __thiscall Value::copy(Value *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *__x;
  Type TVar1;
  long lVar2;
  longlong lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  anon_union_48_10_37e00c34_for_mData *this_00;
  
  if (this->mType != Type_Invalid) {
    __assert_fail("isNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Value.cpp"
                  ,0x1d,"void Value::copy(const Value &)");
  }
  TVar1 = *(Type *)dst;
  this->mType = TVar1;
  this_00 = &this->mData;
  __x = dst + 8;
  switch(TVar1) {
  case Type_String:
    (this->mData).voidPtr = (void *)((long)&this->mData + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_00,*(long *)(dst + 8),*(long *)(dst + 0x10) + *(long *)(dst + 8));
    return extraout_EAX;
  case Type_Custom:
    (this->mData).llong = *(longlong *)(dst + 8);
    lVar2 = *(long *)(dst + 0x10);
    *(long *)((long)&this->mData + 8) = lVar2;
    if (lVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        UNLOCK();
        return 0x1945a0;
      }
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      return 0x1945a0;
    }
    break;
  case Type_Map:
    std::
    _Rb_tree<String,_std::pair<const_String,_Value>,_std::_Select1st<std::pair<const_String,_Value>_>,_std::less<String>,_std::allocator<std::pair<const_String,_Value>_>_>
    ::_Rb_tree((_Rb_tree<String,_std::pair<const_String,_Value>,_std::_Select1st<std::pair<const_String,_Value>_>,_std::less<String>,_std::allocator<std::pair<const_String,_Value>_>_>
                *)this_00,
               (_Rb_tree<String,_std::pair<const_String,_Value>,_std::_Select1st<std::pair<const_String,_Value>_>,_std::less<String>,_std::allocator<std::pair<const_String,_Value>_>_>
                *)__x);
    return extraout_EAX_00;
  case Type_List:
    std::vector<Value,_std::allocator<Value>_>::vector
              ((vector<Value,_std::allocator<Value>_> *)this_00,
               (vector<Value,_std::allocator<Value>_> *)__x);
    return extraout_EAX_01;
  default:
    lVar3 = *(longlong *)__x;
    uVar4 = *(undefined8 *)(dst + 0x10);
    uVar5 = *(undefined8 *)(dst + 0x18);
    uVar6 = *(undefined8 *)(dst + 0x20);
    uVar7 = *(undefined8 *)(dst + 0x30);
    *(undefined8 *)((long)&this->mData + 0x20) = *(undefined8 *)(dst + 0x28);
    *(undefined8 *)((long)&this->mData + 0x28) = uVar7;
    *(undefined8 *)((long)&this->mData + 0x10) = uVar5;
    *(undefined8 *)((long)&this->mData + 0x18) = uVar6;
    this_00->llong = lVar3;
    *(undefined8 *)((long)&this->mData + 8) = uVar4;
  }
  return (int)this;
}

Assistant:

inline bool isNull() const { return mType == Type_Invalid; }